

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

void __thiscall
ArgsManager::logArgsPrefix
          (ArgsManager *this,string *prefix,string *section,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
          *args)

{
  long lVar1;
  _Base_ptr p_Var2;
  string_view source_file;
  bool bVar3;
  optional<unsigned_int> oVar4;
  Logger *pLVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  string value_str;
  string section_str;
  string local_78;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (section->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&section_str,"",(allocator<char> *)&log_msg);
  }
  else {
    std::operator+(&log_msg,"[",section);
    std::operator+(&section_str,&log_msg,"] ");
    std::__cxx11::string::~string((string *)&log_msg);
  }
  for (p_Var6 = (args->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(args->_M_t)._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    p_Var2 = p_Var6[2]._M_parent;
    for (p_Var7 = *(_Base_ptr *)(p_Var6 + 2); p_Var7 != p_Var2;
        p_Var7 = (_Base_ptr)&p_Var7[2]._M_right) {
      std::operator+(&log_msg,'-',
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var6 + 1));
      oVar4 = GetArgFlags(this,&log_msg);
      std::__cxx11::string::~string((string *)&log_msg);
      if (((ulong)oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) {
        if ((oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_payload >> 10 & 1) == 0) {
          UniValue::write_abi_cxx11_((UniValue *)&value_str,(int)p_Var7,(void *)0x0,0);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&value_str,"****",(allocator<char> *)&log_msg);
        }
        pLVar5 = LogInstance();
        bVar3 = BCLog::Logger::Enabled(pLVar5);
        if (bVar3) {
          log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
          log_msg._M_string_length = 0;
          log_msg.field_2._M_local_buf[0] = '\0';
          tinyformat::
          format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (&local_78,(tinyformat *)"%s %s%s=%s\n",(char *)prefix,&section_str,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var6 + 1),&value_str,in_stack_fffffffffffffea8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&log_msg,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          pLVar5 = LogInstance();
          local_78._M_dataplus._M_p = (pointer)0x58;
          local_78._M_string_length = 0x198a62;
          in_stack_fffffffffffffea8 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x58;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/args.cpp"
          ;
          source_file._M_len = 0x58;
          str._M_str = log_msg._M_dataplus._M_p;
          str._M_len = log_msg._M_string_length;
          logging_function._M_str = "logArgsPrefix";
          logging_function._M_len = 0xd;
          BCLog::Logger::LogPrintStr(pLVar5,str,logging_function,source_file,0x34e,ALL,Info);
          std::__cxx11::string::~string((string *)&log_msg);
        }
        std::__cxx11::string::~string((string *)&value_str);
      }
    }
  }
  std::__cxx11::string::~string((string *)&section_str);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ArgsManager::logArgsPrefix(
    const std::string& prefix,
    const std::string& section,
    const std::map<std::string, std::vector<common::SettingsValue>>& args) const
{
    std::string section_str = section.empty() ? "" : "[" + section + "] ";
    for (const auto& arg : args) {
        for (const auto& value : arg.second) {
            std::optional<unsigned int> flags = GetArgFlags('-' + arg.first);
            if (flags) {
                std::string value_str = (*flags & SENSITIVE) ? "****" : value.write();
                LogPrintf("%s %s%s=%s\n", prefix, section_str, arg.first, value_str);
            }
        }
    }
}